

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::Thread(Thread *this)

{
  shared_ptr<EventLoop> local_20;
  Thread *local_10;
  Thread *this_local;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_00302630;
  this->mAutoDelete = false;
  local_10 = this;
  std::mutex::mutex(&this->mMutex);
  this->mRunning = false;
  EventLoop::eventLoop();
  std::weak_ptr<EventLoop>::weak_ptr<EventLoop,void>(&this->mLoop,&local_20);
  std::shared_ptr<EventLoop>::~shared_ptr(&local_20);
  return;
}

Assistant:

Thread::Thread()
    : mAutoDelete(false), mRunning(false), mLoop(EventLoop::eventLoop())
{
}